

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(void)

{
  void *__ptr;
  size_t sVar1;
  char *__dest;
  char *char_ptr;
  char *str;
  int i_1;
  int i;
  int *num_ptr;
  int nums [5];
  
  nums[0] = 3;
  nums[1] = 4;
  nums[2] = 5;
  __ptr = malloc(0x14);
  for (str._4_4_ = 0; str._4_4_ < 5; str._4_4_ = str._4_4_ + 1) {
    *(int *)((long)__ptr + (long)(int)str._4_4_ * 4) = nums[(long)(int)str._4_4_ + -2];
  }
  for (str._0_4_ = 0; (uint)str < 5; str._0_4_ = (uint)str + 1) {
    printf("%i ",(ulong)*(uint *)((long)__ptr + (long)(int)(uint)str * 4));
  }
  printf("\n");
  free(__ptr);
  sVar1 = strlen("Hello World!");
  __dest = (char *)malloc(sVar1 + 1);
  strcpy(__dest,"Hello World!");
  printf("char_ptr = %s\n",__dest);
  free(__dest);
  return 0;
}

Assistant:

int main() {

    int nums[] = {1, 2, 3, 4, 5};

    int *num_ptr;

    num_ptr = (int *)malloc(5 * sizeof(int));

    for (int i = 0; i < sizeof(nums)/sizeof(int); i++) {
        num_ptr[i] = nums[i];
    }

    for (int i = 0; i < sizeof(nums)/sizeof(int); i++) {
        printf("%i ", num_ptr[i]);
    }
    printf("\n");

    free(num_ptr);

    /* char str[] = {'h','e','l','l','o','\0'}; */
    char *str = "Hello World!";

    char *char_ptr;

    char_ptr = (char *)malloc(strlen(str)+1);

    /*
    for (int i = 0; i < strlen(str) + 1; i++) {
        char_ptr[i] = str[i];
    }
    */
    strcpy(char_ptr, str);

    printf("char_ptr = %s\n", char_ptr);

    free(char_ptr);

    return 0;
}